

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O1

string * __thiscall
kws::Parser::GetLastErrors_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  char *pcVar1;
  pointer pEVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  paVar3 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pEVar2 = (this->m_ErrorList).
           super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pEVar2 != (this->m_ErrorList).
                super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar1 = (char *)operator_new__(10);
      snprintf(pcVar1,10,"%ld",pEVar2->number,in_R8,in_R9,paVar3);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      operator_delete__(pcVar1);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pcVar1 = (char *)operator_new__(10);
      snprintf(pcVar1,10,"%ld",pEVar2->line);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      operator_delete__(pcVar1);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pEVar2->description)._M_dataplus._M_p);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      pEVar2 = pEVar2 + 1;
    } while (pEVar2 != (this->m_ErrorList).
                       super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::GetLastErrors()
{
  std::string output = "";
  std::vector<Error>::const_iterator it = m_ErrorList.begin();
  while(it != m_ErrorList.end())
    {
    output += "Error #";
    constexpr size_t length = 10;
    char* val = new char[length];
    snprintf(val,length,"%ld",(*it).number);
    output += val;
    delete [] val;
    output += " (";
    val = new char[length];
    snprintf(val,length,"%ld",(*it).line);
    output += val;
    delete [] val;
    output += ") ";
    output += (*it).description;
    output += "\n";
    it++;
    }
  return output;
}